

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O3

void new_declaration(Grammar *g,Elem *e,uint kind)

{
  Declaration **ppDVar1;
  uint uVar2;
  Declaration **ppDVar3;
  Declaration *elem;
  
  elem = (Declaration *)malloc(0x10);
  elem->elem = e;
  elem->kind = kind;
  uVar2 = (g->declarations).n;
  elem->index = uVar2;
  ppDVar3 = (g->declarations).v;
  ppDVar1 = (g->declarations).e;
  if (ppDVar3 == (Declaration **)0x0) {
    (g->declarations).v = ppDVar1;
    (g->declarations).n = uVar2 + 1;
    (g->declarations).e[uVar2] = elem;
  }
  else {
    if (ppDVar3 == ppDVar1) {
      if (2 < uVar2) goto LAB_0013922a;
    }
    else if ((uVar2 & 7) == 0) {
LAB_0013922a:
      vec_add_internal(&g->declarations,elem);
      return;
    }
    (g->declarations).n = uVar2 + 1;
    ppDVar3[uVar2] = elem;
  }
  return;
}

Assistant:

void new_declaration(Grammar *g, Elem *e, uint kind) {
  Declaration *d = MALLOC(sizeof(*d));
  d->elem = e;
  d->kind = kind;
  d->index = g->declarations.n;
  vec_add(&g->declarations, d);
}